

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage<google::protobuf::FileDescriptorProto>
          (ParseContext *this,FileDescriptorProto *msg,char *ptr)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  ParseContext *ptr_00;
  undefined1 auVar6 [12];
  
  bVar1 = *ptr;
  if ((char)bVar1 < '\0') {
    auVar6 = google::protobuf::internal::ReadSizeFallback(ptr,(uint)bVar1);
  }
  else {
    auVar6[8] = bVar1;
    auVar6._0_8_ = ptr + 1;
    auVar6._9_3_ = 0;
  }
  ptr_00 = auVar6._0_8_;
  if (ptr_00 != (ParseContext *)0x0) {
    iVar3 = EpsCopyInputStream::PushLimit
                      (&this->super_EpsCopyInputStream,(char *)ptr_00,auVar6._8_4_);
    iVar2 = this->depth_;
    this->depth_ = iVar2 + -1;
    if (((0 < iVar2) &&
        (pcVar4 = (char *)google::protobuf::FileDescriptorProto::_InternalParse((char *)msg,ptr_00),
        pcVar4 != (char *)0x0)) && (this->depth_ = this->depth_ + 1, *(int *)&this->field_0x50 == 0)
       ) {
      uVar5 = iVar3 + *(int *)&this->field_0x1c;
      *(uint *)&this->field_0x1c = uVar5;
      *(long *)this = (long)(int)((int)uVar5 >> 0x1f & uVar5) + *(long *)&this->field_0x8;
      return pcVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* ParseContext::ParseMessage(
    T* msg, const char* ptr) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  auto old = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  ptr = msg->_InternalParse(ptr, this);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}